

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommand.h
# Opt level: O2

void __thiscall cmInstallCommand::cmInstallCommand(cmInstallCommand *this)

{
  (this->super_cmCommand).Makefile = (cmMakefile *)0x0;
  (this->super_cmCommand).Error._M_dataplus._M_p = (pointer)&(this->super_cmCommand).Error.field_2;
  (this->super_cmCommand).Error._M_string_length = 0;
  (this->super_cmCommand).Error.field_2._M_local_buf[0] = '\0';
  (this->super_cmCommand)._vptr_cmCommand = (_func_int **)&PTR__cmInstallCommand_0053c4e8;
  (this->DefaultComponentName)._M_dataplus._M_p = (pointer)&(this->DefaultComponentName).field_2;
  (this->DefaultComponentName)._M_string_length = 0;
  (this->DefaultComponentName).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

cmCommand() = default;